

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O2

string * Color::strip(string *__return_storage_ptr__,string *input)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = (uint)input->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar3;
  }
  bVar5 = false;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    cVar1 = (input->_M_dataplus)._M_p[uVar3];
    if (bVar5) {
      bVar5 = cVar1 != 'm';
    }
    else {
      bVar5 = true;
      if (cVar1 != '\x1b') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        bVar5 = false;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Color::strip (const std::string& input)
{
#ifdef FEATURE_COLOR
  int length = input.length ();
  bool inside = false;
  std::string output;
  for (int i = 0; i < length; ++i)
  {
    if (inside)
    {
      if (input[i] == 'm')
        inside = false;
    }
    else
    {
      if (input[i] == 033)
        inside = true;
      else
        output += input[i];
    }
  }

  return output;
#else
  return input;
#endif
}